

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chset.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::
compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>::
test_posix(compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
           *this,char_type ch,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  unsigned_short *puVar1;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  _Var2;
  
  if ((this->posix_yes_ &
      (tr->super_cpp_regex_traits<char>).super_cpp_regex_traits_base<char,_1UL>.masks_[(byte)ch]) !=
      0) {
    return true;
  }
  puVar1 = (this->posix_no_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_pred<boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::not_posix_pred>>
                    ((this->posix_no_).
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start,puVar1);
  return _Var2._M_current != puVar1;
}

Assistant:

bool test_posix(char_type ch, Traits const &tr) const
    {
        not_posix_pred const pred = {ch, &tr};
        return tr.isctype(ch, this->posix_yes_)
            || any(this->posix_no_.begin(), this->posix_no_.end(), pred);
    }